

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::shared_ptr<supermap::io::FileManager>,std::shared_ptr<supermap::io::FileManager>>
          (String *__return_storage_ptr__,detail *this,shared_ptr<supermap::io::FileManager> *lhs,
          char *op,shared_ptr<supermap::io::FileManager> *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = getTlsOss();
  std::ostream::_M_insert<void_const*>(poVar1);
  getTlsOssResult();
  String::String(&local_68,(char *)lhs);
  String::operator+(&local_38,&local_50,&local_68);
  poVar1 = getTlsOss();
  std::ostream::_M_insert<void_const*>(poVar1);
  getTlsOssResult();
  String::operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }